

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_manager.cc
# Opt level: O2

void __thiscall xsettingsd::SettingsManager::RunEventLoop(SettingsManager *this)

{
  undefined8 uVar1;
  FILE *__stream;
  bool bVar2;
  uint __i;
  int iVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  char *pcVar7;
  Window *pWVar8;
  DataWriter writer;
  fd_set fds;
  XEvent event;
  
  iVar3 = XConnectionNumber(this->display_);
  while( true ) {
    do {
      while (iVar4 = XPending(this->display_), iVar4 != 0) {
        XNextEvent(this->display_,&event);
        if (event.type == 0x22) {
          XRefreshKeyboardMapping(&event);
        }
        else {
          if (event.type == 0x1d) {
            fprintf(_stderr,"%s: 0x%x took a selection from us; exiting\n",kProgName,
                    (ulong)(uint)event.xgeneric.extension);
            DestroyWindows(this);
            return;
          }
          fprintf(_stderr,"%s: Ignoring event of type %d\n",kProgName);
        }
      }
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
        fds.fds_bits[lVar5] = 0;
      }
      fds.fds_bits[iVar3 / 0x40] = fds.fds_bits[iVar3 / 0x40] | 1L << ((byte)iVar3 & 0x3f);
      iVar4 = select(iVar3 + 1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
    } while (iVar4 != -1);
    piVar6 = __errno_location();
    __stream = _stderr;
    uVar1 = kProgName;
    if (*piVar6 != 4) break;
    fprintf(_stderr,"%s: Reloading configuration\n",kProgName);
    bVar2 = LoadConfig(this);
    if (bVar2) {
      DataWriter::DataWriter(&writer,(char *)&event.type,0x10000);
      bVar2 = WriteProperty(this,&writer);
      if (bVar2) {
        for (pWVar8 = (this->windows_).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pWVar8 != (this->windows_).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish; pWVar8 = pWVar8 + 1) {
          SetPropertyOnWindow(this,*pWVar8,(char *)&event.type,writer.bytes_written_);
        }
      }
    }
  }
  pcVar7 = strerror(*piVar6);
  fprintf(__stream,"%s: select() failed: %s\n",uVar1,pcVar7);
  return;
}

Assistant:

void SettingsManager::RunEventLoop() {
  int x11_fd = XConnectionNumber(display_);
  // TODO: Need to also use XAddConnectionWatch()?

  while (true) {
    // Rather than blocking in XNextEvent(), we just read all the available
    // events here.  We block in select() instead, so that we'll get EINTR
    // if a SIGHUP came in to ask us to reload the config.
    while (XPending(display_)) {
      XEvent event;
      XNextEvent(display_, &event);

      switch (event.type) {
        case MappingNotify:
          // Doesn't really mean anything to us, but might as well handle it.
          XRefreshKeyboardMapping(&(event.xmapping));
          break;
        case SelectionClear: {
          // If someone else took the selection, that's our sign to leave.
          fprintf(stderr, "%s: 0x%x took a selection from us; exiting\n",
                  kProgName,
                  static_cast<unsigned int>(event.xselectionclear.window));
          DestroyWindows();
          return;
        }
        default:
          fprintf(stderr, "%s: Ignoring event of type %d\n",
                  kProgName, event.type);
      }
    }

    // TODO: There's a small race condition here, in that SIGHUP can come
    // in while we're outside of the select() call, but it's probably not
    // worth trying to work around.

    fd_set fds;
    FD_ZERO(&fds);
    FD_SET(x11_fd, &fds);
    if (select(x11_fd + 1, &fds, NULL, NULL, NULL) == -1) {
      if (errno != EINTR) {
        fprintf(stderr, "%s: select() failed: %s\n",
                kProgName, strerror(errno));
        return;
      }

      fprintf(stderr, "%s: Reloading configuration\n", kProgName);
      if (!LoadConfig())
        continue;

      char data[kMaxPropertySize];
      DataWriter writer(data, kMaxPropertySize);
      if (!WriteProperty(&writer))
        continue;

      for (vector<Window>::const_iterator it = windows_.begin();
           it != windows_.end(); ++it) {
        SetPropertyOnWindow(*it, data, writer.bytes_written());
      }
    }
  }
}